

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemCommand.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_33c8f::BasicBuildSystemFrontendDelegate::~BasicBuildSystemFrontendDelegate
          (BasicBuildSystemFrontendDelegate *this)

{
  (this->super_BuildSystemFrontendDelegate).super_BuildSystemDelegate._vptr_BuildSystemDelegate =
       (_func_int **)&PTR__BasicBuildSystemFrontendDelegate_00201578;
  sigaction(2,(sigaction *)&this->previousSigintHandler,(sigaction *)0x0);
  llbuild::basic::sys::close(DAT_0020892c);
  DAT_0020892c = 0xffffffff;
  std::unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>::
  ~unique_ptr(&this->fileSystem);
  llbuild::buildsystem::BuildSystemFrontendDelegate::~BuildSystemFrontendDelegate
            (&this->super_BuildSystemFrontendDelegate);
  return;
}

Assistant:

~BasicBuildSystemFrontendDelegate() {
    // Restore any previous SIGINT handler.
#if defined(_WIN32)
    signal(SIGINT, previousSigintHandler);
#else
    sigaction(SIGINT, &previousSigintHandler, NULL);
#endif

    // Close the signal watching pipe.
    basic::sys::close(BasicBuildSystemFrontendDelegate::signalWatchingPipe[1]);
    signalWatchingPipe[1] = -1;
  }